

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_efad74::AV1LbdInvTxfm2d_gt_int16_Test::TestBody
          (AV1LbdInvTxfm2d_gt_int16_Test *this)

{
  bool bVar1;
  TxType tp;
  uint8_t i;
  TxSize sz;
  int j;
  int in_stack_0000919c;
  int in_stack_000091a0;
  TxSize in_stack_000091a6;
  TxType in_stack_000091a7;
  AV1LbdInvTxfm2d *in_stack_000091a8;
  byte local_e;
  int local_c;
  
  for (local_c = 0; local_c < 0x13; local_c = local_c + 1) {
    for (local_e = 0; local_e < 8; local_e = local_e + 1) {
      bVar1 = libaom_test::IsTxSizeTypeValid((TX_SIZE)local_c,""[local_e]);
      if (bVar1) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (in_stack_000091a8,in_stack_000091a7,in_stack_000091a6,in_stack_000091a0,
                   in_stack_0000919c);
      }
    }
  }
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, gt_int16) {
  static const TxType types[] = { DCT_DCT, ADST_DCT, FLIPADST_DCT, IDTX,
                                  V_DCT,   H_DCT,    H_ADST,       H_FLIPADST };
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    const TxSize sz = static_cast<TxSize>(j);
    for (uint8_t i = 0; i < sizeof(types) / sizeof(types[0]); ++i) {
      const TxType tp = types[i];
      if (libaom_test::IsTxSizeTypeValid(sz, tp)) {
        RunAV1InvTxfm2dTest(tp, sz, 1, 1);
      }
    }
  }
}